

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidRandomUniformDistributionWrongMinMax(void)

{
  RepeatedField<long> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  bool bVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  long *plVar10;
  FeatureDescription *pFVar11;
  NeuralNetworkLayer *pNVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  void *pvVar14;
  RandomUniformLikeLayerParams *pRVar15;
  ostream *poVar16;
  string *psVar17;
  long lVar18;
  RandomUniformStaticLayerParams *pRVar19;
  unsigned_long *puVar20;
  RandomUniformDynamicLayerParams *pRVar21;
  undefined8 *puVar22;
  int iVar23;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar24;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  uint32_t size;
  uint uVar25;
  Arena *pAVar26;
  Model m;
  Result res3;
  Result res2;
  Result res1;
  Model MStack_d8;
  Result local_a8;
  Result local_80;
  Result local_58;
  
  CoreML::Specification::Model::Model(&MStack_d8,(Arena *)0x0,false);
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b9d1b:
    pRVar24 = &(MStack_d8.description_)->input_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar23 = ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_001b9d1b;
    ((MStack_d8.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar14 = pRVar4->elements[iVar23];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"input",puVar22);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar26);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar25 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar25;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar25 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar25] = 5;
  uVar25 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar25;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar25 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar25] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_d8.description_ == (ModelDescription *)0x0) {
    pAVar26 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_d8.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar26);
  }
  pRVar4 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b9e87:
    pRVar24 = &(MStack_d8.description_)->output_;
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar24->super_RepeatedPtrFieldBase).arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar24->super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar23 = ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_001b9e87;
    ((MStack_d8.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar14 = pRVar4->elements[iVar23];
  }
  puVar22 = (undefined8 *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
    puVar22 = (undefined8 *)*puVar22;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar14 + 0x10),"output",puVar22);
  if (*(long *)((long)pvVar14 + 0x20) == 0) {
    pAVar26 = (Arena *)(*(ulong *)((long)pvVar14 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar14 + 8) & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar26);
    *(FeatureType **)((long)pvVar14 + 0x20) = pFVar8;
  }
  pFVar8 = *(FeatureType **)((long)pvVar14 + 0x20);
  if (pFVar8->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    uVar5 = (pFVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar26);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9 = (pFVar8->Type_).multiarraytype_;
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar2] = 3;
  uVar25 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar25;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar25 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar25] = 5;
  uVar25 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar25;
  uVar3 = (pAVar9->shape_).total_size_;
  if (uVar25 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar10 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar10[uVar25] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (MStack_d8._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_d8);
    MStack_d8._oneof_case_[0] = 500;
    pAVar26 = (Arena *)(MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_d8.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    MStack_d8.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar26);
  }
  (MStack_d8.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_d8.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ba00c:
    this = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
           &(MStack_d8.Type_.pipeline_)->models_;
    pNVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar12 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this,pNVar12);
  }
  else {
    iVar23 = (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_001ba00c;
    (MStack_d8.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar23 + 1;
    pNVar12 = (NeuralNetworkLayer *)pRVar4->elements[iVar23];
  }
  pRVar4 = (pNVar12->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ba044:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->input_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar23 = (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_001ba044;
    (pNVar12->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar14 = pRVar4->elements[iVar23];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3cb973);
  pRVar4 = (pNVar12->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001ba094:
    pbVar13 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar12->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar14 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar12->output_).super_RepeatedPtrFieldBase,pbVar13);
  }
  else {
    iVar23 = (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_001ba094;
    (pNVar12->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar14 = pRVar4->elements[iVar23];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar14,0,*(char **)((long)pvVar14 + 8),0x3dece7);
  if (pNVar12->_oneof_case_[0] != 0x4a6) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
    pNVar12->_oneof_case_[0] = 0x4a6;
    uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar26 = *(Arena **)pAVar26;
    }
    pRVar15 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::RandomUniformLikeLayerParams>(pAVar26);
    (pNVar12->layer_).randomuniformlike_ = pRVar15;
  }
  (((pNVar12->layer_).convolution_)->kernelsize_).arena_or_elements_ = (void *)0x3ecccccd3f99999a;
  CoreML::validate<(MLModelType)500>(&local_58,&MStack_d8);
  bVar7 = CoreML::Result::good(&local_58);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x162b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  else {
    psVar17 = CoreML::Result::message_abi_cxx11_(&local_58);
    lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8f5c,0);
    if (lVar18 != -1) {
      if (pNVar12->_oneof_case_[0] != 0x4ab) {
        CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
        pNVar12->_oneof_case_[0] = 0x4ab;
        uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
        pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
        if ((uVar5 & 1) != 0) {
          pAVar26 = *(Arena **)pAVar26;
        }
        pRVar19 = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::RandomUniformStaticLayerParams>(pAVar26)
        ;
        (pNVar12->layer_).randomuniformstatic_ = pRVar19;
      }
      pCVar6 = (pNVar12->layer_).convolution_;
      uVar2 = (pCVar6->kernelsize_).current_size_;
      uVar3 = (pCVar6->kernelsize_).total_size_;
      if (uVar2 == uVar3) {
        google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar6->kernelsize_,uVar3 + 1);
      }
      puVar20 = google::protobuf::RepeatedField<unsigned_long>::elements(&pCVar6->kernelsize_);
      puVar20[uVar2] = 3;
      (pCVar6->kernelsize_).current_size_ = uVar2 + 1;
      (pCVar6->stride_).arena_or_elements_ = (void *)0x3ecccccd3f99999a;
      CoreML::validate<(MLModelType)500>(&local_80,&MStack_d8);
      bVar7 = CoreML::Result::good(&local_80);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1634);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
LAB_001ba5c2:
        std::ostream::put((char)poVar16);
        iVar23 = 1;
        std::ostream::flush();
      }
      else {
        psVar17 = CoreML::Result::message_abi_cxx11_(&local_80);
        lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8f5c,0);
        if (lVar18 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1635);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"res2.message().find(\"smaller\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          goto LAB_001ba5c2;
        }
        if (pNVar12->_oneof_case_[0] != 0x4b0) {
          CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar12);
          pNVar12->_oneof_case_[0] = 0x4b0;
          uVar5 = (pNVar12->super_MessageLite)._internal_metadata_.ptr_;
          pAVar26 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar26 = *(Arena **)pAVar26;
          }
          pRVar21 = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::RandomUniformDynamicLayerParams>
                              (pAVar26);
          (pNVar12->layer_).randomuniformdynamic_ = pRVar21;
        }
        (((pNVar12->layer_).convolution_)->kernelsize_).arena_or_elements_ =
             (void *)0x3ecccccd3f99999a;
        CoreML::validate<(MLModelType)500>(&local_a8,&MStack_d8);
        bVar7 = CoreML::Result::good(&local_a8);
        if (bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x163c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          std::ostream::put((char)poVar16);
          iVar23 = 1;
          std::ostream::flush();
        }
        else {
          psVar17 = CoreML::Result::message_abi_cxx11_(&local_a8);
          iVar23 = 0;
          lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8f5c,0);
          if (lVar18 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x163d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"res3.message().find(\"smaller\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16," was false, expected true.",0x1a);
            iVar23 = 1;
            std::endl<char,std::char_traits<char>>(poVar16);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.m_message._M_dataplus._M_p != &local_a8.m_message.field_2) {
          operator_delete(local_a8.m_message._M_dataplus._M_p,
                          local_a8.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001ba6ce;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x162c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"res1.message().find(\"smaller\") != std::string::npos",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  std::ostream::put((char)poVar16);
  iVar23 = 1;
  std::ostream::flush();
LAB_001ba6ce:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    local_58.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_d8);
  return iVar23;
}

Assistant:

int testInvalidRandomUniformDistributionWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_randomuniformlike();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    auto* params2 = layers->mutable_randomuniformstatic();
    params2->add_outputshape(3);
    params2->set_minval(1.2f);
    params2->set_maxval(0.4f);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("smaller") != std::string::npos);

    auto* params3 = layers->mutable_randomuniformdynamic();
    params3->set_minval(1.2f);
    params3->set_maxval(0.4f);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("smaller") != std::string::npos);

    return 0;
}